

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ZSTD_freeCCtxContent(ZSTD_CCtx *cctx)

{
  void *__ptr;
  ZSTD_freeFunction UNRECOVERED_JUMPTABLE;
  void *pvVar1;
  
  if (cctx == (ZSTD_CCtx *)0x0) {
    __assert_fail("cctx != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x5163,"void ZSTD_freeCCtxContent(ZSTD_CCtx *)");
  }
  if (cctx->staticSize != 0) {
    __assert_fail("cctx->staticSize == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x5164,"void ZSTD_freeCCtxContent(ZSTD_CCtx *)");
  }
  ZSTD_clearAllDicts(cctx);
  ZSTDMT_freeCCtx(cctx->mtctx);
  cctx->mtctx = (ZSTDMT_CCtx *)0x0;
  __ptr = (cctx->workspace).workspace;
  UNRECOVERED_JUMPTABLE = (cctx->customMem).customFree;
  pvVar1 = (cctx->customMem).opaque;
  (cctx->workspace).objectEnd = (void *)0x0;
  (cctx->workspace).tableEnd = (void *)0x0;
  (cctx->workspace).tableValidEnd = (void *)0x0;
  (cctx->workspace).allocStart = (void *)0x0;
  (cctx->workspace).initOnceStart = (void *)0x0;
  (cctx->workspace).allocFailed = '\0';
  *(undefined3 *)&(cctx->workspace).field_0x39 = 0;
  (cctx->workspace).workspaceOversizedDuration = 0;
  (cctx->workspace).phase = ZSTD_cwksp_alloc_objects;
  (cctx->workspace).isStatic = ZSTD_cwksp_dynamic_alloc;
  (cctx->workspace).workspace = (void *)0x0;
  (cctx->workspace).workspaceEnd = (void *)0x0;
  if (__ptr == (void *)0x0) {
    return;
  }
  if (UNRECOVERED_JUMPTABLE != (ZSTD_freeFunction)0x0) {
    (*UNRECOVERED_JUMPTABLE)(pvVar1,__ptr);
    return;
  }
  free(__ptr);
  return;
}

Assistant:

static void ZSTD_freeCCtxContent(ZSTD_CCtx* cctx)
{
    assert(cctx != NULL);
    assert(cctx->staticSize == 0);
    ZSTD_clearAllDicts(cctx);
#ifdef ZSTD_MULTITHREAD
    ZSTDMT_freeCCtx(cctx->mtctx); cctx->mtctx = NULL;
#endif
    ZSTD_cwksp_free(&cctx->workspace, cctx->customMem);
}